

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

void * TtfUtil::FindCmapSubtable(void *pCmap,int nPlatformId,int nEncodingId)

{
  uint16 uVar1;
  uint16 uVar2;
  uint32 uVar3;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  void *pRtn;
  int i;
  uint16 csuPlatforms;
  CharacterCodeMap *pTable;
  int local_28;
  
  uVar1 = read<unsigned_short>(0);
  local_28 = 0;
  while( true ) {
    if ((int)(uint)uVar1 <= local_28) {
      return (void *)0x0;
    }
    uVar2 = read<unsigned_short>(0);
    if ((uVar2 == in_ESI) &&
       ((in_EDX == 0xffffffff || (uVar2 = read<unsigned_short>(0), uVar2 == in_EDX)))) break;
    local_28 = local_28 + 1;
  }
  uVar3 = read<unsigned_int>(0);
  return (void *)(in_RDI + (ulong)uVar3);
}

Assistant:

void * FindCmapSubtable(const void * pCmap, 
								 int nPlatformId, /* =3 */
								 int nEncodingId) /* = 1 */
{
	const Sfnt::CharacterCodeMap * pTable = 
		reinterpret_cast<const Sfnt::CharacterCodeMap *>(pCmap);
	
	uint16 csuPlatforms = read(pTable->num_subtables);
	for (int i = 0; i < csuPlatforms; i++)
	{
		if (read(pTable->encoding[i].platform_id) == nPlatformId &&
			(nEncodingId == -1 || read(pTable->encoding[i].platform_specific_id) == nEncodingId))
		{
			const void * pRtn = reinterpret_cast<const uint8 *>(pCmap) + 
				read(pTable->encoding[i].offset);
			return const_cast<void *>(pRtn);
		}
	}

	return 0;
}